

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O2

ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
 testing::
 ValuesIn<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,int_const*,int_const*,unsigned_int*)>,66ul>
           (TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
            (*array) [66])

{
  ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
  *impl;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
  PVar1;
  
  impl = (ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
          *)operator_new(0x20);
  impl->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__ValuesInIteratorRangeGenerator_00f69598;
  impl[1]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  impl[2]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  impl[3]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  std::
  vector<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,int_const*,int_const*,unsigned_int*)>,std::allocator<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,int_const*,int_const*,unsigned_int*)>>>
  ::
  _M_range_initialize<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,int_const*,int_const*,unsigned_int*)>const*>
            ((vector<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,int_const*,int_const*,unsigned_int*)>,std::allocator<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,int_const*,int_const*,unsigned_int*)>>>
              *)(impl + 1),::(anonymous_namespace)::kArrayHBDObmcSubpelVariance_c,
             ::(anonymous_namespace)::kArrayVariance_sse2);
  internal::
  ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
  ::ParamGenerator((ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
                    *)array,impl);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)array;
  return (ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}